

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O1

int amqp_decode_array(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_array_t *output,size_t *offset,
                     int depth)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  void *__ptr;
  void *pvVar4;
  amqp_field_value_t_ *__dest;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar7 = encoded.len;
  sVar2 = *offset;
  uVar8 = sVar2 + 4;
  *offset = uVar8;
  if (uVar7 < uVar8) {
    uVar6 = 0;
  }
  else {
    uVar1 = *(uint *)((long)encoded.bytes + sVar2);
    uVar6 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
  }
  iVar3 = -2;
  if ((uVar8 <= uVar7) && (uVar6 = uVar6 + uVar8, uVar6 <= uVar7)) {
    __ptr = malloc(0x180);
    if (__ptr == (void *)0x0) {
      iVar3 = -1;
    }
    else {
      uVar8 = 0;
      if (*offset < uVar6) {
        iVar5 = 0x10;
        lVar9 = 0;
        uVar8 = 0;
        do {
          pvVar4 = __ptr;
          if ((long)iVar5 <= (long)uVar8) {
            iVar5 = iVar5 * 2;
            pvVar4 = realloc(__ptr,(long)iVar5 * 0x18);
            if (pvVar4 == (void *)0x0) {
              iVar3 = -1;
              goto LAB_0010aed8;
            }
          }
          __ptr = pvVar4;
          iVar3 = amqp_decode_field_value
                            (encoded,pool,(amqp_field_value_t *)((long)__ptr + lVar9),offset,depth);
          if (iVar3 < 0) goto LAB_0010aed8;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while (*offset < uVar6);
      }
      output->num_entries = (int)uVar8;
      sVar2 = (uVar8 & 0xffffffff) * 0x18;
      __dest = (amqp_field_value_t_ *)amqp_pool_alloc(pool,sVar2);
      output->entries = __dest;
      if (__dest == (amqp_field_value_t_ *)0x0) {
        iVar3 = -(uint)((int)uVar8 != 0);
      }
      else {
        memcpy(__dest,__ptr,sVar2);
        iVar3 = 0;
      }
LAB_0010aed8:
      free(__ptr);
    }
  }
  return iVar3;
}

Assistant:

static int amqp_decode_array(amqp_bytes_t encoded, amqp_pool_t *pool,
                             amqp_array_t *output, size_t *offset, int depth) {
  uint32_t arraysize;
  int num_entries = 0;
  int allocated_entries = INITIAL_ARRAY_SIZE;
  amqp_field_value_t *entries;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &arraysize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (arraysize + *offset > encoded.len) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_field_value_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + arraysize;
  while (*offset < limit) {
    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries =
          realloc(entries, allocated_entries * sizeof(amqp_field_value_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries], offset,
                                  depth);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries =
      amqp_pool_alloc(pool, num_entries * sizeof(amqp_field_value_t));
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL) {
    if (num_entries == 0) {
      res = AMQP_STATUS_OK;
    } else {
      res = AMQP_STATUS_NO_MEMORY;
    }
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_field_value_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}